

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringstorage.c
# Opt level: O3

void * internal_find_add(storage_blocks *sb,string_struct *r,uint8_t prev_bytes,char *s,int doadd)

{
  size_t *psVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  string_struct *psVar5;
  size_t sVar6;
  char *pcVar7;
  char **ppcVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  char cVar12;
  ulong cnt;
  byte *pbVar13;
  ulong uVar14;
  ulong uVar15;
  char *local_50;
  
  cnt = r->child_count;
  local_50 = s;
  if (cnt == 0) {
    uVar15 = 0;
  }
  else {
    sVar9 = sb->user_data_size;
    do {
      psVar5 = r->children;
      uVar15 = 0;
      uVar11 = cnt;
      do {
        uVar14 = uVar15 + uVar11 >> 1;
        pbVar13 = (byte *)psVar5[uVar14].value;
        iVar4 = strcmp(local_50,(char *)(pbVar13 + sVar9 + 1));
        bVar2 = *pbVar13;
        if ((iVar4 == 0) && (bVar2 == prev_bytes)) goto LAB_0010159f;
        bVar3 = iVar4 < 0;
        if (bVar2 != prev_bytes) {
          bVar3 = bVar2 < prev_bytes;
        }
        if (!bVar3) {
          uVar15 = uVar14 + 1;
          uVar14 = uVar11;
        }
        uVar11 = uVar14;
      } while (uVar15 < uVar14);
      if (uVar15 == 0) {
        uVar15 = 0;
        goto LAB_0010146e;
      }
      cVar12 = *local_50;
      if (cVar12 == '\0') goto LAB_0010146e;
      psVar5 = r->children + (uVar15 - 1);
      uVar11 = 0;
      do {
        if (cVar12 != psVar5->value[uVar11 + sb->user_data_size + 1]) break;
        cVar12 = local_50[uVar11 + 1];
        uVar11 = uVar11 + 1;
      } while (cVar12 != '\0');
      if ((uVar11 & 0xff) < 9) goto LAB_0010146e;
      prev_bytes = prev_bytes + (char)uVar11;
      local_50 = local_50 + (uVar11 & 0xff);
      cnt = r->children[uVar15 - 1].child_count;
      r = psVar5;
    } while (cnt != 0);
    uVar15 = 0;
  }
LAB_0010146e:
  if (doadd != 0) {
    psVar5 = (string_struct *)allocate_reallocate_array(r->children,cnt,0x18);
    r->children = psVar5;
    if (psVar5 != (string_struct *)0x0) {
      lVar10 = r->child_count - uVar15;
      if (lVar10 != 0) {
        memmove(psVar5 + uVar15 + 1,psVar5 + uVar15,lVar10 * 0x18);
      }
      sVar6 = strlen(local_50);
      pcVar7 = sb->current;
      if ((pcVar7 == (char *)0x0) ||
         (sVar9 = sb->used_bytes, 0x1000 < sVar6 + sVar9 + 2 + sb->user_data_size)) {
        pcVar7 = (char *)calloc(1,0x1000);
        ppcVar8 = (char **)allocate_reallocate_array(sb->blocks,sb->block_count,8);
        sb->blocks = ppcVar8;
        if (ppcVar8 == (char **)0x0) {
          return (void *)0x0;
        }
        sVar9 = sb->block_count;
        sb->block_count = sVar9 + 1;
        ppcVar8[sVar9] = pcVar7;
        sb->current = pcVar7;
        sb->used_bytes = 0;
        sVar9 = 0;
      }
      psVar5 = r->children;
      psVar5[uVar15].value = pcVar7 + sVar9;
      psVar1 = &psVar5[uVar15].child_count;
      *psVar1 = 0;
      psVar1[1] = 0;
      pcVar7[sVar9] = prev_bytes;
      memcpy(pcVar7 + sVar9 + sb->user_data_size + 1,local_50,sVar6 + 1);
      sb->used_bytes = sb->used_bytes + sVar6 + 2 + sb->user_data_size;
      r->child_count = r->child_count + 1;
      pbVar13 = (byte *)r->children[uVar15].value;
LAB_0010159f:
      return pbVar13 + 1;
    }
  }
  return (void *)0x0;
}

Assistant:

void *internal_find_add(storage_blocks *sb, struct string_struct *r, uint8_t prev_bytes, const char *s, int doadd)
{
	size_t begin = 0;
	size_t end = r->child_count;
	uint8_t common_bytes = 0;
	size_t len;
	char *newvalue;

	while (begin < end)
	{
		size_t mid = (begin + end) >> 1;
		int res = strcmp(s, r->children[mid].value + sb->user_data_size + 1);
		unsigned char sz_p1 = *(r->children[mid].value);
		if ((res == 0) && (sz_p1 == prev_bytes))
		{
			return (void*)(r->children[mid].value + 1);
		}
		else if (sz_p1 == prev_bytes)
		{
			if (res < 0) end = mid; else begin = mid + 1;
		}
		else
		{
			if (sz_p1 < prev_bytes) end = mid; else begin = mid + 1;
		}
	}

	/* 2. check how many bytes common with previous string */
	if (begin != 0) common_bytes = get_common_prefix_size(s, r->children[begin - 1].value + sb->user_data_size + 1);

	if (common_bytes > 8)
	{
		return internal_find_add(sb, &r->children[begin - 1], prev_bytes + common_bytes, s + common_bytes, doadd);
	}

	if (doadd == 0) return 0;

	/* 3. insert string after begin */
	r->children = allocate_reallocate_array(r->children, r->child_count, sizeof(struct string_struct));
	if (r->children == 0) return 0;
	if (begin != r->child_count)
	{
		memmove(&r->children[begin + 1], &r->children[begin],
		  (r->child_count - begin) * sizeof(struct string_struct));
	}

	len = strlen(s) + 1;
	if ((sb->current == 0) || (sb->used_bytes + 1 + len + sb->user_data_size > STORAGE_BLOCK_SIZE))
	{
		char *newcurrent = (char*)calloc(1, STORAGE_BLOCK_SIZE);
		sb->blocks = allocate_reallocate_array(sb->blocks, sb->block_count, sizeof(char*));
		if (sb->blocks == 0) return 0;

		sb->blocks[sb->block_count++] = newcurrent;
		sb->current = newcurrent;
		sb->used_bytes = 0;
	}

	newvalue = sb->current + sb->used_bytes;
	r->children[begin].value = newvalue;
	r->children[begin].child_count = 0;
	r->children[begin].children = 0;
	*(uint8_t*)(newvalue) = prev_bytes;
	memcpy(newvalue + sb->user_data_size + 1, s, len);
	sb->used_bytes += sb->user_data_size + 1 + len;
	r->child_count++;
	return (void*)(r->children[begin].value + 1);
}